

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

void FIX::file_mkdir(char *path)

{
  size_t sVar1;
  char *__path;
  char *local_58;
  char *pos;
  allocator<char> local_39;
  string local_38 [8];
  string createPath;
  int length;
  char *path_local;
  
  sVar1 = strlen(path);
  createPath.field_2._12_4_ = (undefined4)sVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::allocator<char>::~allocator(&local_39);
  for (local_58 = path; (long)local_58 - (long)path <= (long)(int)createPath.field_2._12_4_;
      local_58 = local_58 + 1) {
    std::__cxx11::string::operator+=(local_38,*local_58);
    if (((*local_58 == '/') || (*local_58 == '\\')) ||
       ((long)local_58 - (long)path == (long)(int)createPath.field_2._12_4_)) {
      __path = (char *)std::__cxx11::string::c_str();
      mkdir(__path,0x1ff);
    }
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void file_mkdir(const char *path) {
  int length = (int)strlen(path);
  std::string createPath = "";

  for (const char *pos = path; (pos - path) <= length; ++pos) {
    createPath += *pos;
    if (*pos == '/' || *pos == '\\' || (pos - path) == length) {
#ifdef _MSC_VER
      _mkdir(createPath.c_str());
#else
      // use umask to override rwx for all
      mkdir(createPath.c_str(), 0777);
#endif
    }
  }
}